

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

void __thiscall
AVSInterface::AVSInDelegator::AVSInDelegator
          (AVSInDelegator *this,AVSValue *args,vector<Param,_std::allocator<Param>_> *params)

{
  char *__s;
  bool bVar1;
  mapped_type *pmVar2;
  allocator<char> local_69;
  key_type local_68;
  reference local_48;
  Param *param;
  iterator __end2;
  iterator __begin2;
  vector<Param,_std::allocator<Param>_> *__range2;
  int idx;
  vector<Param,_std::allocator<Param>_> *params_local;
  AVSValue *args_local;
  AVSInDelegator *this_local;
  
  InDelegator::InDelegator(&this->super_InDelegator);
  (this->super_InDelegator)._vptr_InDelegator = (_func_int **)&PTR_Read_00144b68;
  AVSValue::AVSValue(&this->_args,args);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->_params_index_map);
  __range2._4_4_ = 0;
  __end2 = std::vector<Param,_std::allocator<Param>_>::begin(params);
  param = (Param *)std::vector<Param,_std::allocator<Param>_>::end(params);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>
                                     *)&param), bVar1) {
    local_48 = __gnu_cxx::__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>::
               operator*(&__end2);
    if ((local_48->AVSEnabled & 1U) != 0) {
      __s = local_48->Name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->_params_index_map,&local_68);
      *pmVar2 = __range2._4_4_;
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __gnu_cxx::__normal_iterator<Param_*,_std::vector<Param,_std::allocator<Param>_>_>::operator++
              (&__end2);
  }
  return;
}

Assistant:

AVSInDelegator(const AVSValue args, std::vector<Param> params) : _args(args)
    {
      int idx = 0;
      for (auto &&param : params)
      {
        if (!param.AVSEnabled) continue;
        _params_index_map[param.Name] = idx++;
      }
    }